

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  invalid_argument *this_01;
  element_type *peVar3;
  Dictionary *in_RSI;
  long in_RDI;
  bool quant_input;
  istream *in_stack_fffffffffffffe98;
  Model *in_stack_fffffffffffffea0;
  Model *this_02;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 qout;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffeb0;
  vector<long,_std::allocator<long>_> *this_03;
  shared_ptr<fasttext::QMatrix> *qwi;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  byte bVar4;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffec8;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffed0;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffed8;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffee0;
  entry_type type;
  istream *in_stack_fffffffffffffee8;
  Dictionary *this_04;
  Matrix *in_stack_fffffffffffffef0;
  undefined1 local_100 [48];
  undefined1 local_d0 [36];
  undefined4 local_ac;
  shared_ptr<fasttext::QMatrix> local_a8;
  istream *in_stack_ffffffffffffff68;
  QMatrix *in_stack_ffffffffffffff70;
  byte local_81 [113];
  Dictionary *local_10;
  
  qout = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  local_10 = in_RSI;
  std::make_shared<fasttext::Args>();
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::Args> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x161ff0);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_fffffffffffffea0->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x162020);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_fffffffffffffea0->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x162050);
  std::make_shared<fasttext::Matrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            (&in_stack_fffffffffffffea0->wi_,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x162080);
  std::make_shared<fasttext::QMatrix>();
  std::shared_ptr<fasttext::QMatrix>::operator=
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x1620b0);
  std::make_shared<fasttext::QMatrix>();
  std::shared_ptr<fasttext::QMatrix>::operator=
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x1620e0);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1620ea);
  Args::load((Args *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if ((*(int *)(in_RDI + 0x9c) == 0xb) &&
     (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x162112), peVar2->model == sup)) {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x162125);
    peVar2->maxn = 0;
  }
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&,std::istream&>
            (in_stack_fffffffffffffec8,
             (basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x16216c);
  std::istream::read((char *)local_10,(long)local_81);
  if ((local_81[0] & 1) == 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1621c5);
    Matrix::load(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    *(undefined1 *)(in_RDI + 0x98) = 1;
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1621a5);
    QMatrix::load(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  if ((local_81[0] & 1) == 0) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1621ed);
    bVar1 = Dictionary::isPruned(this_00);
    if (bVar1) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,
                 "Invalid model file.\nPlease download the updated model from www.fasttext.cc.\nSee issue #332 on Github for more information.\n"
                );
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x162270);
  std::istream::read((char *)local_10,(long)&peVar2->qout);
  this_04 = local_10;
  if (((*(byte *)(in_RDI + 0x98) & 1) == 0) ||
     (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1622a1), this_04 = local_10, (peVar2->qout & 1U) == 0)) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1622d8);
    Matrix::load(in_stack_fffffffffffffef0,(istream *)this_04);
  }
  else {
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1622b8);
    QMatrix::load(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_04 = local_10;
  }
  local_ac = 0;
  qwi = &local_a8;
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)this_04,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe98);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x162349);
  bVar4 = *(byte *)(in_RDI + 0x98);
  peVar3 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x162362);
  peVar3->quant_ = (bool)(bVar4 & 1);
  std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x162379);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe98);
  type = (entry_type)((ulong)local_d0 >> 0x38);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffea0,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe98);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1623be);
  Model::setQuantizePointer
            ((Model *)CONCAT17(bVar4,in_stack_fffffffffffffec0),qwi,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffeb0,(bool)qout);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x1623eb);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x1623f8);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x162402);
  if (peVar2->model == sup) {
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16241d);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x162430);
    this_03 = (vector<long,_std::allocator<long>_> *)(local_100 + 0x18);
    Dictionary::getCounts(this_04,type);
    Model::setTargetCounts
              (in_stack_fffffffffffffea0,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe98);
    std::vector<long,_std::allocator<long>_>::~vector(this_03);
  }
  else {
    peVar3 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1624d1);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1624e3);
    this_02 = (Model *)local_100;
    Dictionary::getCounts(this_04,type);
    Model::setTargetCounts(this_02,(vector<long,_std::allocator<long>_> *)peVar3);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
	args_ = std::make_shared<Args>();
	input_ = std::make_shared<Matrix>();
	weights_ = std::make_shared<Matrix>();
	output_ = std::make_shared<Matrix>();
	qinput_ = std::make_shared<QMatrix>();
	qoutput_ = std::make_shared<QMatrix>();
	args_->load(in);
	if (version == 11 && args_->model == model_name::sup) {
		// backward compatibility: old supervised models do not use char ngrams.
		args_->maxn = 0;
	}
	dict_ = std::make_shared<Dictionary>(args_, in);

	bool quant_input;
	in.read((char*)&quant_input, sizeof(bool));
	if (quant_input) {
		quant_ = true;
		qinput_->load(in);
	} else {
		input_->load(in);
	}

	if (!quant_input && dict_->isPruned()) {
		throw std::invalid_argument(
				"Invalid model file.\n"
				"Please download the updated model from www.fasttext.cc.\n"
				"See issue #332 on Github for more information.\n");
	}

	in.read((char*)&args_->qout, sizeof(bool));
	if (quant_ && args_->qout) {
		qoutput_->load(in);
	} else {
		output_->load(in);
	}

	model_ = std::make_shared<Model>(input_, output_, weights_, args_, 0);
	model_->quant_ = quant_;
	model_->setQuantizePointer(qinput_, qoutput_, args_->qout);

	if (args_->model == model_name::sup) {
		model_->setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model_->setTargetCounts(dict_->getCounts(entry_type::word));
	}
}